

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void test_xor(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *prVar4;
  uint64_t uVar5;
  roaring_bitmap_t *r_00;
  uint64_t uVar6;
  long lVar7;
  roaring_bitmap_t **pprVar8;
  int i_1;
  char *__format;
  int iVar9;
  uint32_t i;
  uint uVar10;
  roaring_bitmap_t **pprVar11;
  roaring_bitmap_t *r [10];
  roaring_bitmap_t *local_b0;
  roaring_bitmap_t *local_80 [4];
  roaring_bitmap_t *local_60;
  roaring_bitmap_t *local_58;
  roaring_bitmap_t *local_50;
  roaring_bitmap_t *local_48;
  undefined8 local_40;
  
  uVar10 = 0;
  prVar2 = roaring_bitmap_create_with_capacity(0);
  (prVar2->high_low_container).flags = (prVar2->high_low_container).flags & 0xfe | copy_on_write;
  prVar3 = roaring_bitmap_create_with_capacity(0);
  (prVar3->high_low_container).flags = (prVar3->high_low_container).flags & 0xfe | copy_on_write;
  do {
    if ((uVar10 & 1) == 0) {
      roaring_bitmap_add(prVar2,uVar10);
    }
    if ((short)((short)((uVar10 & 0xffff) / 3) * -3 + (short)uVar10) == 0) {
      roaring_bitmap_add(prVar3,uVar10);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 300);
  prVar4 = roaring_bitmap_xor(prVar2,prVar3);
  (prVar4->high_low_container).flags = (prVar4->high_low_container).flags & 0xfe | copy_on_write;
  iVar9 = 0;
  uVar10 = 0;
  do {
    if (((short)uVar10 == (ushort)(((ushort)((uVar10 & 0xffff) / 3) & 0xfffe) * 3)) ||
       (((short)uVar10 != (short)((short)((uVar10 & 0xffff) / 3) * 3) & (byte)uVar10) != 0)) {
      _Var1 = roaring_bitmap_contains(prVar4,uVar10);
      __format = "surplus %d\n";
      if (_Var1) goto LAB_001059ab;
    }
    else {
      iVar9 = iVar9 + 1;
      _Var1 = roaring_bitmap_contains(prVar4,uVar10);
      __format = "missing %d\n";
      if (!_Var1) {
LAB_001059ab:
        printf(__format,(ulong)uVar10);
      }
    }
    uVar10 = uVar10 + 1;
    if (uVar10 == 300) {
      uVar5 = roaring_bitmap_get_cardinality(prVar4);
      _assert_int_equal(uVar5,(long)iVar9,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                        ,0x790);
      roaring_bitmap_free(prVar4);
      roaring_bitmap_free(prVar3);
      roaring_bitmap_free(prVar2);
      prVar2 = gen_bitmap(0.0,1e-06,1,0,0,1000000);
      local_80[0] = gen_bitmap(1.0,-1e-06,1,0,0,1000000);
      local_80[1] = gen_bitmap(1e-05,0.0,1,0,0,2000000);
      local_80[2] = gen_bitmap(1e-05,0.0,3,0,0,2000000);
      local_80[3] = gen_bitmap(0.1,0.0,1,0,0,2000000);
      local_60 = gen_bitmap(0.001,1e-07,1,0,0,1000000);
      local_58 = gen_bitmap(0.0,1e-10,1,0,0,1000000);
      local_50 = gen_bitmap(0.5,-1e-06,1,600000,800000,1000000);
      local_48 = gen_bitmap(1.0,-1e-06,1,300000,500000,1000000);
      local_40 = 0;
      if (prVar2 != (roaring_bitmap_t *)0x0) {
        pprVar8 = local_80;
        lVar7 = 0;
        prVar3 = prVar2;
        local_b0 = prVar2;
        pprVar11 = pprVar8;
        do {
          do {
            prVar4 = synthesized_xor(local_b0,prVar3);
            r_00 = roaring_bitmap_xor(local_b0,prVar3);
            uVar5 = roaring_bitmap_get_cardinality(r_00);
            uVar6 = roaring_bitmap_xor_cardinality(local_b0,prVar3);
            _assert_true((ulong)(uVar5 == uVar6),
                         "roaring_bitmap_get_cardinality(result) == roaring_bitmap_xor_cardinality(r[i], r[j])"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                         ,0x7b3);
            _Var1 = roaring_bitmap_equals(prVar4,r_00);
            _assert_true((ulong)_Var1,"is_equal",
                         "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                         ,0x7b7);
            roaring_bitmap_free(prVar4);
            roaring_bitmap_free(r_00);
            prVar3 = *pprVar8;
            pprVar8 = pprVar8 + 1;
          } while (prVar3 != (roaring_bitmap_t *)0x0);
          prVar3 = local_80[lVar7];
          lVar7 = lVar7 + 1;
          pprVar8 = pprVar11 + 1;
          local_b0 = prVar3;
          pprVar11 = pprVar8;
        } while (prVar3 != (roaring_bitmap_t *)0x0);
        if (prVar2 != (roaring_bitmap_t *)0x0) {
          pprVar8 = local_80;
          do {
            roaring_bitmap_free(prVar2);
            prVar2 = *pprVar8;
            pprVar8 = pprVar8 + 1;
          } while (prVar2 != (roaring_bitmap_t *)0x0);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void test_xor(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }

    roaring_bitmap_t *r1_xor_r2 = roaring_bitmap_xor(r1, r2);
    roaring_bitmap_set_copy_on_write(r1_xor_r2, copy_on_write);

    int ansctr = 0;
    for (int i = 0; i < 300; ++i) {
        if (((i % 2 == 0) || (i % 3 == 0)) && (i % 6 != 0)) {
            ansctr++;
            if (!roaring_bitmap_contains(r1_xor_r2, i))
                printf("missing %d\n", i);
        } else if (roaring_bitmap_contains(r1_xor_r2, i))
            printf("surplus %d\n", i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1_xor_r2), ansctr);

    roaring_bitmap_free(r1_xor_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data

    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_xor(r[i], r[j]);
            roaring_bitmap_t *result = roaring_bitmap_xor(r[i], r[j]);
            assert_true(roaring_bitmap_get_cardinality(result) ==
                        roaring_bitmap_xor_cardinality(r[i], r[j]));

            bool is_equal = roaring_bitmap_equals(expected, result);

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(result);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}